

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::prepareExpandedExpression(AssertionResult *result)

{
  long lVar1;
  long in_FS_OFFSET;
  string local_28 [24];
  AssertionResult *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertionResult::getExpandedExpression_abi_cxx11_(in_stack_fffffffffffffff0);
  std::__cxx11::string::~string(local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void prepareExpandedExpression(AssertionResult& result) {
        result.getExpandedExpression();
    }